

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_rdp.c
# Opt level: O3

_Bool csp_rdp_conn_is_active(csp_conn_t *conn)

{
  uint32_t uVar1;
  bool bVar2;
  
  uVar1 = csp_get_ms();
  bVar2 = -1 < (int)((conn->timestamp - uVar1) + (conn->rdp).conn_timeout);
  if ((!bVar2) && (csp_dbg_rdp_print != '\0')) {
    csp_print_func("\x1b[31mRDP %p: Timeout no packets received last %u ms\n\x1b[0m",conn);
  }
  return ((conn->rdp).state & ~RDP_CLOSE_WAIT) != RDP_CLOSED && bVar2;
}

Assistant:

bool csp_rdp_conn_is_active(csp_conn_t *conn) {

	uint32_t time_now = csp_get_ms();
	bool active = true;

	if (csp_rdp_time_after(time_now, conn->timestamp + conn->rdp.conn_timeout)) {
		/* The RDP connection has timed out */
		csp_rdp_error("RDP %p: Timeout no packets received last %u ms\n", (void *)conn, conn->rdp.conn_timeout);
		active = false;
	}

	if (conn->rdp.state == RDP_CLOSE_WAIT || conn->rdp.state == RDP_CLOSED) {
		active = false;
	}

	return active;

}